

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool ucurr_isAvailable_63(UChar *isoCode,UDate from,UDate to,UErrorCode *eErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UHashtable *hash;
  UResourceBundle *pUVar3;
  undefined8 *value;
  UResourceBundle *resB;
  UResourceBundle *pUVar4;
  int32_t *piVar5;
  void *pvVar6;
  UErrorCode UVar7;
  uint uVar8;
  ulong uVar9;
  int indexR;
  double dVar10;
  UErrorCode localStatus;
  int32_t fromLength;
  int32_t isoLength;
  UErrorCode local_90;
  int32_t local_8c;
  UDate local_88;
  UDate local_80;
  UHashtable *local_78;
  int32_t local_6c;
  UChar *local_68;
  UResourceBundle *local_60;
  ulong local_58;
  UResourceBundle *local_50;
  double local_48;
  double local_40;
  UChar *local_38;
  
  if (U_ZERO_ERROR < *eErrorCode) {
    return '\0';
  }
  local_88 = from;
  local_80 = to;
  if ((gIsoCodesInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar1 = icu_63::umtx_initImplPreInit(&gIsoCodesInitOnce), UVar1 == '\0')) {
    if (U_ZERO_ERROR < gIsoCodesInitOnce.fErrCode) {
      *eErrorCode = gIsoCodesInitOnce.fErrCode;
      return '\0';
    }
  }
  else {
    ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
    hash = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,eErrorCode);
    UVar7 = *eErrorCode;
    if (UVar7 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_78 = hash;
      uhash_setValueDeleter_63(hash,deleteIsoCodeEntry);
      local_90 = U_ZERO_ERROR;
      pUVar3 = ures_openDirect_63("icudt63l-curr","supplementalData",&local_90);
      pUVar3 = ures_getByKey_63(pUVar3,"CurrencyMap",pUVar3,&local_90);
      if (local_90 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar2 = ures_getSize_63(pUVar3);
        if (0 < iVar2) {
          uVar9 = 0;
          local_68 = isoCode;
          local_60 = pUVar3;
          do {
            local_58 = uVar9;
            pUVar3 = ures_getByIndex_63(pUVar3,(int32_t)uVar9,(UResourceBundle *)0x0,&local_90);
            if (local_90 < U_ILLEGAL_ARGUMENT_ERROR) {
              iVar2 = ures_getSize_63(pUVar3);
              if (0 < iVar2) {
                indexR = 0;
                local_50 = pUVar3;
                do {
                  pUVar3 = ures_getByIndex_63(pUVar3,indexR,(UResourceBundle *)0x0,&local_90);
                  value = (undefined8 *)uprv_malloc_63(0x18);
                  if (value == (undefined8 *)0x0) {
                    *eErrorCode = U_MEMORY_ALLOCATION_ERROR;
                    isoCode = local_68;
                    goto LAB_002cb80d;
                  }
                  local_6c = 0;
                  resB = ures_getByKey_63(pUVar3,"id",(UResourceBundle *)0x0,&local_90);
                  if (resB != (UResourceBundle *)0x0) {
                    local_38 = ures_getString_63(resB,&local_6c,&local_90);
                    pUVar4 = ures_getByKey_63(pUVar3,"from",(UResourceBundle *)0x0,&local_90);
                    dVar10 = -1.79769313486232e+308;
                    if (local_90 < U_ILLEGAL_ARGUMENT_ERROR) {
                      local_8c = 0;
                      piVar5 = ures_getIntVector_63(pUVar4,&local_8c,&local_90);
                      dVar10 = (double)CONCAT44(*piVar5,piVar5[1]);
                    }
                    local_40 = dVar10;
                    ures_close_63(pUVar4);
                    local_90 = U_ZERO_ERROR;
                    pUVar4 = ures_getByKey_63(pUVar3,"to",(UResourceBundle *)0x0,&local_90);
                    dVar10 = 1.79769313486232e+308;
                    if (local_90 < U_ILLEGAL_ARGUMENT_ERROR) {
                      local_8c = 0;
                      piVar5 = ures_getIntVector_63(pUVar4,&local_8c,&local_90);
                      dVar10 = (double)CONCAT44(*piVar5,piVar5[1]);
                    }
                    local_48 = dVar10;
                    ures_close_63(pUVar4);
                    ures_close_63(resB);
                    ures_close_63(pUVar3);
                    *value = local_38;
                    value[1] = local_40;
                    value[2] = local_48;
                    local_90 = U_ZERO_ERROR;
                    uhash_put_63(local_78,local_38,value,&local_90);
                  }
                  pUVar3 = local_50;
                  indexR = indexR + 1;
                  iVar2 = ures_getSize_63(local_50);
                } while (indexR < iVar2);
              }
            }
            else {
              *eErrorCode = local_90;
            }
            ures_close_63(pUVar3);
            pUVar3 = local_60;
            uVar8 = (int)local_58 + 1;
            uVar9 = (ulong)uVar8;
            iVar2 = ures_getSize_63(local_60);
            isoCode = local_68;
          } while ((int)uVar8 < iVar2);
        }
      }
      else {
        *eErrorCode = local_90;
      }
      ures_close_63(pUVar3);
      UVar7 = *eErrorCode;
      if (UVar7 < U_ILLEGAL_ARGUMENT_ERROR) {
        gIsoCodes = local_78;
      }
      else {
LAB_002cb80d:
        uhash_close_63(local_78);
        UVar7 = *eErrorCode;
      }
    }
    gIsoCodesInitOnce.fErrCode = UVar7;
    icu_63::umtx_initImplPostInit(&gIsoCodesInitOnce);
  }
  if ((*eErrorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (pvVar6 = uhash_get_63(gIsoCodes,isoCode), pvVar6 != (void *)0x0)) {
    if (local_88 <= local_80) {
      if ((local_88 < *(double *)((long)pvVar6 + 0x10) ||
           local_88 == *(double *)((long)pvVar6 + 0x10)) &&
         (*(double *)((long)pvVar6 + 8) <= local_80)) {
        return '\x01';
      }
    }
    else {
      *eErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }